

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVR3File.cpp
# Opt level: O2

void __thiscall BVR3File::BVR3File(BVR3File *this,vector<char,_std::allocator<char>_> *buf)

{
  byte bVar1;
  char cVar2;
  pointer __src;
  pointer pBVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  size_t __size;
  pointer ppcVar7;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  _List_node_base *p_Var11;
  int iVar12;
  char *__locale;
  char *pcVar13;
  pointer ppcVar14;
  size_t __n;
  BRDPoint BVar15;
  int iVar16;
  ulong uVar17;
  byte *pbVar18;
  BRDPoint BVar19;
  byte *pbVar20;
  _List_node_base *p_Var21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  char *pold;
  byte *__nptr;
  byte *pbVar26;
  byte *pbVar27;
  const_iterator __position;
  uint uVar28;
  byte *pbVar29;
  byte *pbVar30;
  byte *local_218;
  char *local_210;
  value_type first_outline_segment;
  undefined1 local_1d8 [24];
  char *local_1c0;
  double local_1b8;
  char *local_1b0;
  char *pcStack_1a8;
  BRDPoint start_point;
  char *arena;
  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
  outline_segments;
  vector<char_*,_std::allocator<char_*>_> lines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_118;
  byte *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  BRDPart part;
  BRDPart blank_part;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_002033b0;
  uVar17 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  __locale = setlocale(1,"C");
  if (uVar17 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first_outline_segment,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
               ,(allocator<char> *)&local_218);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &first_outline_segment,":");
    std::__cxx11::to_string((string *)&arena,0x19);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                   &local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &outline_segments,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,": ")
    ;
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &outline_segments,"BVR3File::BVR3File(std::vector<char> &)");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   &local_138,": Assertion `");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&blank_part,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                   "\' failed.");
    std::__cxx11::string::operator=
              ((string *)&(this->super_BRDFileBase).error_msg,(string *)&blank_part);
    std::__cxx11::string::~string((string *)&blank_part);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&outline_segments);
    std::__cxx11::string::~string((string *)&lines);
    std::__cxx11::string::~string((string *)&arena);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&first_outline_segment);
    SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
  }
  else {
    __size = (uVar17 + 1) * 3;
    pcVar13 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar13;
    if (pcVar13 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first_outline_segment,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
                 ,(allocator<char> *)&local_218);
      std::operator+(&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first_outline_segment,":");
      std::__cxx11::to_string((string *)&arena,0x1c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     &local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arena);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &outline_segments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lines,
                     ": ");
      std::operator+(&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &outline_segments,"BVR3File::BVR3File(std::vector<char> &)");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     &local_138,": Assertion `");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                     "file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &blank_part,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                     "\' failed.");
      std::__cxx11::string::operator=
                ((string *)&(this->super_BRDFileBase).error_msg,(string *)&blank_part);
      std::__cxx11::string::~string((string *)&blank_part);
      std::__cxx11::string::~string((string *)&part);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&outline_segments);
      std::__cxx11::string::~string((string *)&lines);
      std::__cxx11::string::~string((string *)&arena);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&first_outline_segment);
      SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar13,__src,__n);
      }
      pcVar13[uVar17] = '\0';
      arena = pcVar13 + uVar17 + 1;
      blank_part.name = (char *)0x0;
      pcVar13[__size - 1] = '\0';
      blank_part.mfgcode._M_dataplus._M_p = (pointer)&blank_part.mfgcode.field_2;
      blank_part.mfgcode._M_string_length = 0;
      blank_part.mfgcode.field_2._M_local_buf[0] = '\0';
      blank_part.mounting_side = Both;
      blank_part.part_type = SMD;
      blank_part.end_of_pins = 0;
      blank_part.p1.x = 0;
      blank_part.p1.y = 0;
      blank_part.p2.x = 0;
      blank_part.p2.y = 0;
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity._0_4_ = 0;
      part.name = (char *)0x0;
      part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
      part.mfgcode._M_string_length = 0;
      local_108._M_dataplus._M_p = (char *)0x0;
      local_108._M_string_length = 0;
      part.mfgcode.field_2._M_local_buf[0] = '\0';
      part.mounting_side = Both;
      part.part_type = SMD;
      part.end_of_pins = 0;
      part.p1.x = 0;
      part.p1.y = 0;
      part.p2.x = 0;
      part.p2.y = 0;
      local_1d8._0_4_ = 0;
      local_1d8._4_4_ = 0;
      local_1d8._8_8_ = 0;
      local_1d8._16_8_ = (ulong)(uint)local_1d8._20_4_ << 0x20;
      local_1c0 = "UNCONNECTED";
      local_1b8 = 0.5;
      local_1b0 = (char *)0x0;
      pcStack_1a8 = (char *)0x0;
      outline_segments.
      super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&outline_segments;
      outline_segments.
      super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
      ._M_impl._M_node._M_size = 0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      outline_segments.
      super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           outline_segments.
           super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      stringfile(pcVar13,&lines);
      ppcVar7 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_210 = pcVar13 + (__size - 1);
      local_118 = &(this->super_BRDFileBase).format;
      for (ppcVar14 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppcVar14 != ppcVar7; ppcVar14 = ppcVar14 + 1
          ) {
        pcVar13 = *ppcVar14;
        pbVar27 = (byte *)(pcVar13 + 0xb);
        pbVar8 = (byte *)(pcVar13 + 9);
        pbVar9 = (byte *)(pcVar13 + 10);
        pbVar10 = (byte *)(pcVar13 + 0xc);
        __nptr = (byte *)(pcVar13 + 0x11);
        do {
          pbVar26 = __nptr;
          pbVar18 = pbVar10;
          pbVar30 = pbVar9;
          pbVar20 = pbVar8;
          pbVar29 = pbVar27;
          bVar1 = pbVar26[-0x11];
          iVar12 = isspace((uint)bVar1);
          __nptr = pbVar26 + 1;
          pbVar27 = pbVar29 + 1;
          pbVar8 = pbVar20 + 1;
          pbVar9 = pbVar30 + 1;
          pbVar10 = pbVar18 + 1;
        } while (iVar12 != 0);
        if (bVar1 != 0) {
          local_110 = pbVar26 + -0x11;
          iVar12 = strncmp((char *)local_110,"PART_NAME ",10);
          if (iVar12 == 0) {
            pbVar26 = pbVar26 + -7;
            while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                   (iVar12 = isspace(uVar28), iVar12 != 0))) {
              pbVar26 = pbVar26 + 1;
              pbVar29 = pbVar29 + 1;
            }
            while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0))) {
              uVar28 = (uint)*pbVar29;
              pbVar29 = pbVar29 + 1;
            }
            pbVar29[-1] = 0;
            local_218 = pbVar29;
            part.name = fix_to_utf8((char *)pbVar26,&arena,local_210);
          }
          else {
            iVar12 = strncmp((char *)local_110,"PART_SIDE ",10);
            pbVar27 = local_110;
            if (iVar12 == 0) {
              pbVar26 = pbVar26 + -7;
              while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                     (iVar12 = isspace(uVar28), iVar12 != 0))) {
                pbVar26 = pbVar26 + 1;
                pbVar29 = pbVar29 + 1;
              }
              while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0))) {
                uVar28 = (uint)*pbVar29;
                pbVar29 = pbVar29 + 1;
              }
              pbVar29[-1] = 0;
              local_218 = pbVar29;
              pcVar13 = fix_to_utf8((char *)pbVar26,&arena,local_210);
              cVar2 = *pcVar13;
              if (cVar2 == 'B') {
                if (pcVar13[1] == '\0') {
                  part.mounting_side = Bottom;
                }
              }
              else if (cVar2 == 'O') {
                if (pcVar13[1] == '\0') {
                  part._40_8_ = (ulong)part.part_type << 0x20;
                }
              }
              else if ((cVar2 == 'T') && (pcVar13[1] == '\0')) {
                part.mounting_side = Top;
              }
            }
            else {
              iVar12 = strncmp((char *)local_110,"PART_ORIGIN ",0xc);
              if (iVar12 != 0) {
                iVar12 = strncmp((char *)pbVar27,"PART_MOUNT ",0xb);
                if (iVar12 == 0) {
                  pbVar26 = pbVar26 + -6;
                  while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                         (iVar12 = isspace(uVar28), iVar12 != 0))) {
                    pbVar26 = pbVar26 + 1;
                    pbVar18 = pbVar18 + 1;
                  }
                  while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0))) {
                    uVar28 = (uint)*pbVar18;
                    pbVar18 = pbVar18 + 1;
                  }
                  pbVar18[-1] = 0;
                  local_218 = pbVar18;
                  pcVar13 = fix_to_utf8((char *)pbVar26,&arena,local_210);
                  iVar12 = strcmp(pcVar13,"SMD");
                  if (iVar12 == 0) {
                    part._40_8_ = part._40_8_ & 0xffffffff;
                  }
                  else {
                    part.part_type = ThroughHole;
                  }
                }
                else {
                  iVar12 = strncmp((char *)pbVar27,"PART_OUTLINE_RELATIVE ",0x16);
                  if ((iVar12 != 0) && (iVar12 = strncmp((char *)pbVar27,"PIN_ID ",7), iVar12 != 0))
                  {
                    iVar12 = strncmp((char *)pbVar27,"PIN_NUMBER ",0xb);
                    if (iVar12 == 0) {
                      pbVar26 = pbVar26 + -6;
                      while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                             (iVar12 = isspace(uVar28), iVar12 != 0))) {
                        pbVar26 = pbVar26 + 1;
                        pbVar18 = pbVar18 + 1;
                      }
                      while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0))) {
                        uVar28 = (uint)*pbVar18;
                        pbVar18 = pbVar18 + 1;
                      }
                      pbVar18[-1] = 0;
                      local_218 = pbVar18;
                      local_1b0 = fix_to_utf8((char *)pbVar26,&arena,local_210);
                    }
                    else {
                      iVar12 = strncmp((char *)pbVar27,"PIN_NAME ",9);
                      if (iVar12 == 0) {
                        pbVar26 = pbVar26 + -8;
                        while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                               (iVar12 = isspace(uVar28), iVar12 != 0))) {
                          pbVar26 = pbVar26 + 1;
                          pbVar30 = pbVar30 + 1;
                        }
                        while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0))) {
                          uVar28 = (uint)*pbVar30;
                          pbVar30 = pbVar30 + 1;
                        }
                        pbVar30[-1] = 0;
                        local_218 = pbVar30;
                        pcStack_1a8 = fix_to_utf8((char *)pbVar26,&arena,local_210);
                      }
                      else {
                        iVar12 = strncmp((char *)pbVar27,"PIN_SIDE ",9);
                        if (iVar12 == 0) {
                          pbVar26 = pbVar26 + -8;
                          while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0 &&
                                 (iVar12 = isspace(uVar28), iVar12 != 0))) {
                            pbVar26 = pbVar26 + 1;
                            pbVar30 = pbVar30 + 1;
                          }
                          while (((char)uVar28 != '\0' && (iVar12 = isspace(uVar28), iVar12 == 0)))
                          {
                            uVar28 = (uint)*pbVar30;
                            pbVar30 = pbVar30 + 1;
                          }
                          pbVar30[-1] = 0;
                          local_218 = pbVar30;
                          pcVar13 = fix_to_utf8((char *)pbVar26,&arena,local_210);
                          cVar2 = *pcVar13;
                          if (cVar2 == 'B') {
                            if (pcVar13[1] == '\0') {
                              local_1d8._16_4_ = 1;
                            }
                          }
                          else if (cVar2 == 'O') {
                            if (pcVar13[1] == '\0') {
                              local_1d8._16_8_ = (ulong)(uint)local_1d8._20_4_ << 0x20;
                            }
                          }
                          else if ((cVar2 == 'T') && (pcVar13[1] == '\0')) {
                            local_1d8._16_4_ = 2;
                          }
                        }
                        else {
                          iVar12 = strncmp((char *)pbVar27,"PIN_ORIGIN ",0xb);
                          if (iVar12 == 0) {
                            local_218 = pbVar26 + -6;
                            dVar4 = strtod((char *)local_218,(char **)&local_218);
                            dVar4 = trunc(dVar4);
                            local_1d8._0_4_ = (int)dVar4;
                            dVar4 = strtod((char *)local_218,(char **)&local_218);
                            dVar4 = trunc(dVar4);
                            local_1d8._4_4_ = (int)dVar4;
                          }
                          else {
                            iVar12 = strncmp((char *)pbVar27,"PIN_RADIUS ",0xb);
                            if (iVar12 == 0) {
                              local_218 = pbVar26 + -6;
                              local_1b8 = strtod((char *)local_218,(char **)&local_218);
                            }
                            else {
                              iVar12 = strncmp((char *)pbVar27,"PIN_NET ",8);
                              if (iVar12 == 0) {
                                pbVar26 = pbVar26 + -9;
                                while ((uVar28 = (uint)*pbVar26, local_218 = pbVar26, *pbVar26 != 0
                                       && (iVar12 = isspace(uVar28), iVar12 != 0))) {
                                  pbVar26 = pbVar26 + 1;
                                  pbVar20 = pbVar20 + 1;
                                }
                                while (((char)uVar28 != '\0' &&
                                       (iVar12 = isspace(uVar28), iVar12 == 0))) {
                                  uVar28 = (uint)*pbVar20;
                                  pbVar20 = pbVar20 + 1;
                                }
                                pbVar20[-1] = 0;
                                local_218 = pbVar20;
                                local_1c0 = fix_to_utf8((char *)pbVar26,&arena,local_210);
                              }
                              else {
                                iVar12 = strncmp((char *)pbVar27,"PIN_TYPE ",9);
                                if (((iVar12 != 0) &&
                                    (iVar12 = strncmp((char *)pbVar27,"PIN_COMMENT ",0xc),
                                    iVar12 != 0)) &&
                                   (iVar12 = strncmp((char *)pbVar27,"PIN_OUTLINE_RELATIVE ",0x15),
                                   iVar12 != 0)) {
                                  iVar12 = strcmp((char *)pbVar27,"PIN_END");
                                  if (iVar12 == 0) {
                                    local_1d8._12_4_ =
                                         (int)(((long)(this->super_BRDFileBase).parts.
                                                                                                            
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->super_BRDFileBase).parts.
                                                                                                          
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x48)
                                         + 1;
                                    std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                              (&(this->super_BRDFileBase).pins,
                                               (value_type *)local_1d8);
                                    local_1d8._16_8_ =
                                         CONCAT44(local_138.field_2._M_allocated_capacity._4_4_,
                                                  local_138.field_2._M_allocated_capacity._0_4_);
                                    local_1d8._0_8_ = local_138._M_dataplus._M_p;
                                    local_1d8._8_8_ = local_138._M_string_length;
                                    local_1c0 = "UNCONNECTED";
                                    local_1b8 = 0.5;
                                    local_1b0 = local_108._M_dataplus._M_p;
                                    pcStack_1a8 = (char *)local_108._M_string_length;
                                  }
                                  else {
                                    iVar12 = strcmp((char *)pbVar27,"PART_END");
                                    if (iVar12 == 0) {
                                      part.end_of_pins =
                                           (uint)(((long)(this->super_BRDFileBase).pins.
                                                                                                                  
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->super_BRDFileBase).pins.
                                                                                                                
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) / 0x38)
                                      ;
                                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                                (&(this->super_BRDFileBase).parts,&part);
                                      BRDPart::operator=(&part,&blank_part);
                                    }
                                    else {
                                      iVar12 = strncmp((char *)pbVar27,"OUTLINE_POINTS ",0xf);
                                      if (iVar12 == 0) {
                                        local_218 = pbVar26 + -2;
                                        pbVar27 = local_218;
                                        while (*pbVar27 != 0) {
                                          first_outline_segment.first.x = 0;
                                          first_outline_segment.first.y = 0;
                                          dVar4 = strtod((char *)pbVar27,(char **)&local_218);
                                          dVar4 = trunc(dVar4);
                                          first_outline_segment.first.x = (int)dVar4;
                                          dVar4 = strtod((char *)local_218,(char **)&local_218);
                                          dVar4 = trunc(dVar4);
                                          pbVar8 = local_218;
                                          first_outline_segment.first.y = (int)dVar4;
                                          if (pbVar27 == local_218) break;
                                          std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                          push_back(local_118,&first_outline_segment.first);
                                          pbVar27 = pbVar8;
                                        }
                                      }
                                      else {
                                        iVar12 = strncmp((char *)pbVar27,"OUTLINE_SEGMENTED ",0x12);
                                        if (iVar12 == 0) {
                                          local_218 = __nptr;
                                          while (*__nptr != 0) {
                                            first_outline_segment.first.x = 0;
                                            first_outline_segment.first.y = 0;
                                            first_outline_segment.second.x = 0;
                                            first_outline_segment.second.y = 0;
                                            dVar4 = strtod((char *)__nptr,(char **)&local_218);
                                            dVar4 = trunc(dVar4);
                                            first_outline_segment.first.x = (int)dVar4;
                                            dVar4 = strtod((char *)local_218,(char **)&local_218);
                                            dVar4 = trunc(dVar4);
                                            first_outline_segment.first.y = (int)dVar4;
                                            dVar4 = strtod((char *)local_218,(char **)&local_218);
                                            dVar4 = trunc(dVar4);
                                            first_outline_segment.second.x = (int)dVar4;
                                            dVar4 = strtod((char *)local_218,(char **)&local_218);
                                            dVar4 = trunc(dVar4);
                                            pbVar27 = local_218;
                                            first_outline_segment.second.y = (int)dVar4;
                                            if (__nptr == local_218) break;
                                            std::__cxx11::
                                            list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                            ::push_back(&outline_segments,&first_outline_segment);
                                            __nptr = pbVar27;
                                          }
                                          if (outline_segments.
                                              super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                              ._M_impl._M_node.super__List_node_base._M_next !=
                                              (_List_node_base *)&outline_segments) {
                                            first_outline_segment.first =
                                                 (BRDPoint)
                                                 outline_segments.
                                                 super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_next[1].
                                                 _M_next;
                                            first_outline_segment.second =
                                                 (BRDPoint)
                                                 outline_segments.
                                                 super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_next[1].
                                                 _M_prev;
                                            std::__cxx11::
                                            list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                            ::pop_front(&outline_segments);
                                            this_00 = local_118;
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back(local_118,&first_outline_segment.first);
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back(this_00,&first_outline_segment.second);
                                            start_point = first_outline_segment.first;
                                            uVar17 = (ulong)first_outline_segment.first >> 0x20;
                                            BVar15 = first_outline_segment.first;
                                            BVar19 = first_outline_segment.second;
                                            while( true ) {
                                              iVar16 = BVar19.x;
                                              iVar12 = BVar19.y;
                                              if ((iVar12 == (int)uVar17 && iVar16 == BVar15.x) ||
                                                 (__position._M_node =
                                                       outline_segments.
                                                                                                              
                                                  super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                 outline_segments.
                                                 super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                 ._M_impl._M_node.super__List_node_base._M_next ==
                                                 (_List_node_base *)&outline_segments))
                                              goto LAB_0012dd73;
                                              for (; p_Var21 = outline_segments.
                                                                                                                              
                                                  super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  p_Var11 = outline_segments.
                                                                                                                        
                                                  super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ._M_impl._M_node.super__List_node_base._M_next,
                                                  __position._M_node !=
                                                  (_List_node_base *)&outline_segments;
                                                  __position._M_node =
                                                       (((
                                                  _List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)&(__position._M_node)->_M_next)->_M_impl).
                                                  _M_node.super__List_node_base._M_next) {
                                                if ((*(int *)&__position._M_node[1]._M_next ==
                                                     iVar16) &&
                                                   (*(int *)((long)&__position._M_node[1]._M_next +
                                                            4) == iVar12)) {
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back(this_00,(value_type *)
                                                                    &__position._M_node[1]._M_prev);
                                                  p_Var21 = (_List_node_base *)
                                                            &__position._M_node[1]._M_prev;
                                                  goto LAB_0012e497;
                                                }
                                                if ((*(int *)&__position._M_node[1]._M_prev ==
                                                     iVar16) &&
                                                   (*(int *)((long)&__position._M_node[1]._M_prev +
                                                            4) == iVar12)) {
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back(this_00,(value_type *)
                                                                    (__position._M_node + 1));
                                                  p_Var21 = __position._M_node + 1;
                                                  goto LAB_0012e497;
                                                }
                                              }
                                              while (__position._M_node = p_Var11,
                                                    p_Var21 = (((
                                                  _List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)&p_Var21->_M_next)->_M_impl)._M_node.
                                                  super__List_node_base._M_next,
                                                  p_Var21 != (_List_node_base *)&outline_segments) {
                                                iVar22 = iVar16 - *(int *)&p_Var21[1]._M_next;
                                                iVar5 = -iVar22;
                                                if (0 < iVar22) {
                                                  iVar5 = iVar22;
                                                }
                                                iVar23 = iVar12 - *(int *)((long)&p_Var21[1]._M_next
                                                                          + 4);
                                                iVar22 = -iVar23;
                                                if (0 < iVar23) {
                                                  iVar22 = iVar23;
                                                }
                                                iVar24 = iVar16 - *(int *)&p_Var21[1]._M_prev;
                                                iVar23 = -iVar24;
                                                if (0 < iVar24) {
                                                  iVar23 = iVar24;
                                                }
                                                iVar25 = iVar12 - *(int *)((long)&p_Var21[1]._M_prev
                                                                          + 4);
                                                iVar24 = -iVar25;
                                                if (0 < iVar25) {
                                                  iVar24 = iVar25;
                                                }
                                                uVar28 = iVar24 + iVar23;
                                                if ((uint)(iVar22 + iVar5) <=
                                                    (uint)(iVar24 + iVar23)) {
                                                  uVar28 = iVar22 + iVar5;
                                                }
                                                iVar22 = iVar16 - *(int *)&__position._M_node[1].
                                                                           _M_next;
                                                iVar5 = -iVar22;
                                                if (0 < iVar22) {
                                                  iVar5 = iVar22;
                                                }
                                                iVar23 = iVar12 - *(int *)((long)&__position._M_node
                                                                                  [1]._M_next + 4);
                                                iVar22 = -iVar23;
                                                if (0 < iVar23) {
                                                  iVar22 = iVar23;
                                                }
                                                iVar24 = iVar16 - *(int *)&__position._M_node[1].
                                                                           _M_prev;
                                                iVar23 = -iVar24;
                                                if (0 < iVar24) {
                                                  iVar23 = iVar24;
                                                }
                                                iVar25 = iVar12 - *(int *)((long)&__position._M_node
                                                                                  [1]._M_prev + 4);
                                                iVar24 = -iVar25;
                                                if (0 < iVar25) {
                                                  iVar24 = iVar25;
                                                }
                                                uVar6 = iVar24 + iVar23;
                                                if ((uint)(iVar22 + iVar5) <=
                                                    (uint)(iVar24 + iVar23)) {
                                                  uVar6 = iVar22 + iVar5;
                                                }
                                                p_Var11 = p_Var21;
                                                if (uVar6 <= uVar28) {
                                                  p_Var11 = __position._M_node;
                                                }
                                              }
                                              iVar22 = iVar16 - BVar15.x;
                                              iVar5 = -iVar22;
                                              if (0 < iVar22) {
                                                iVar5 = iVar22;
                                              }
                                              iVar23 = iVar12 - (int)uVar17;
                                              iVar22 = -iVar23;
                                              if (0 < iVar23) {
                                                iVar22 = iVar23;
                                              }
                                              iVar24 = iVar16 - *(int *)&__position._M_node[1].
                                                                         _M_next;
                                              iVar23 = -iVar24;
                                              if (0 < iVar24) {
                                                iVar23 = iVar24;
                                              }
                                              iVar25 = iVar12 - *(int *)((long)&__position._M_node
                                                                                [1]._M_next + 4);
                                              iVar24 = -iVar25;
                                              if (0 < iVar25) {
                                                iVar24 = iVar25;
                                              }
                                              iVar16 = iVar16 - *(int *)&__position._M_node[1].
                                                                         _M_prev;
                                              iVar25 = -iVar16;
                                              if (0 < iVar16) {
                                                iVar25 = iVar16;
                                              }
                                              iVar12 = iVar12 - *(int *)((long)&__position._M_node
                                                                                [1]._M_prev + 4);
                                              iVar16 = -iVar12;
                                              if (0 < iVar12) {
                                                iVar16 = iVar12;
                                              }
                                              if (((uint)(iVar22 + iVar5) <= (uint)(iVar24 + iVar23)
                                                  ) && ((uint)(iVar22 + iVar5) <=
                                                        (uint)(iVar16 + iVar25))) break;
                                              p_Var11 = __position._M_node + 1;
                                              p_Var21 = (_List_node_base *)
                                                        &__position._M_node[1]._M_prev;
                                              if ((uint)(iVar16 + iVar25) < (uint)(iVar24 + iVar23))
                                              {
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back(this_00,(value_type *)p_Var21);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back(this_00,(value_type *)p_Var11);
                                                p_Var21 = p_Var11;
                                              }
                                              else {
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back(this_00,(value_type *)p_Var11);
                                                std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                push_back(this_00,(value_type *)p_Var21);
                                              }
LAB_0012e497:
                                              BVar19 = (BRDPoint)p_Var21->_M_next;
                                              std::__cxx11::
                                              list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                              ::erase(&outline_segments,__position);
                                              BVar15 = (BRDPoint)((ulong)start_point & 0xffffffff);
                                              uVar17 = (ulong)start_point >> 0x20;
                                            }
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back(this_00,&start_point);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0012dd73:
      }
      pBVar3 = (this->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (this->super_BRDFileBase).num_parts =
           (uint)(((long)(this->super_BRDFileBase).parts.
                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_BRDFileBase).parts.
                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x48);
      (this->super_BRDFileBase).num_pins =
           (uint)(((long)(this->super_BRDFileBase).pins.
                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_BRDFileBase).pins.
                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
      (this->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar3 -
                         (long)(this->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (this->super_BRDFileBase).num_nails =
           (uint)(((long)(this->super_BRDFileBase).nails.
                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->super_BRDFileBase).nails.
                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
      setlocale(1,__locale);
      (this->super_BRDFileBase).valid =
           (this->super_BRDFileBase).num_format != 0 || (this->super_BRDFileBase).num_parts != 0;
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
      std::__cxx11::
      _List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>::
      _M_clear(&outline_segments.
                super__List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
              );
      std::__cxx11::string::~string((string *)&part.mfgcode);
      std::__cxx11::string::~string((string *)&blank_part.mfgcode);
    }
  }
  return;
}

Assistant:

BVR3File::BVR3File(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	BRDPart blank_part;
	BRDPin blank_pin;
	BRDPart part;
	BRDPin pin;
	std::list<std::pair<BRDPoint, BRDPoint>> outline_segments;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (!strncmp(line, "PART_NAME ", 10)) {
			p += 10;
			part.name = READ_STR();
		} else if (!strncmp(line, "PART_SIDE ", 10)) {
			p += 10;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				part.mounting_side = BRDPartMountingSide::Top;
			else if (!strcmp(side, "B"))
				part.mounting_side = BRDPartMountingSide::Bottom;
			else if (!strcmp(side, "O"))
				part.mounting_side = BRDPartMountingSide::Both;
		} else if (!strncmp(line, "PART_ORIGIN ", 12)) {
			// Value ignored, used as reference point for relative pin placements, not currently supported
		} else if (!strncmp(line, "PART_MOUNT ", 11)) {
			p += 11;
			char *mount = READ_STR();
			if (!strcmp(mount, "SMD"))
				part.part_type = BRDPartType::SMD;
			else
				part.part_type = BRDPartType::ThroughHole;
		} else if (!strncmp(line, "PART_OUTLINE_RELATIVE ", 22)) {
			// Value ignored, custom outline for parts not yet supported
		} else if (!strncmp(line, "PIN_ID ", 7)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_NUMBER ", 11)) {
			p += 11;
			pin.snum = READ_STR();
		} else if (!strncmp(line, "PIN_NAME ", 9)) {
			p += 9;
			pin.name = READ_STR();
		} else if (!strncmp(line, "PIN_SIDE ", 9)) {
			p += 9;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				pin.side = BRDPinSide::Top;
			else if (!strcmp(side, "B"))
				pin.side = BRDPinSide::Bottom;
			else if (!strcmp(side, "O"))
				pin.side = BRDPinSide::Both;
		} else if (!strncmp(line, "PIN_ORIGIN ", 11)) {
			p += 11;
			double origin_x = READ_DOUBLE();
			pin.pos.x = trunc(origin_x);
			double origin_y = READ_DOUBLE();
			pin.pos.y = trunc(origin_y);
		} else if (!strncmp(line, "PIN_RADIUS ", 11)) {
			p += 11;
			pin.radius = READ_DOUBLE();
		} else if (!strncmp(line, "PIN_NET ", 8)) {
			p += 8;
			pin.net = READ_STR();
		} else if (!strncmp(line, "PIN_TYPE ", 9)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_COMMENT ", 12)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_OUTLINE_RELATIVE ", 21)) {
			// Value ignored, custom outline for pins not yet supported
		} else if (!strcmp(line, "PIN_END")) {
			pin.part = parts.size() + 1; // pin is for current part, which will not yet have been added to parts vector
			pins.push_back(pin);
			pin = blank_pin;
		} else if (!strcmp(line, "PART_END")) {
			part.end_of_pins = pins.size();
			parts.push_back(part);
			part = blank_part;
		} else if (!strncmp(line, "OUTLINE_POINTS ", 15)) {
			p += 15;
			while (p[0]) {
				auto pold = p;
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x);
				double y = READ_DOUBLE();
				point.y  = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				format.push_back(point);
			}
		} else if (!strncmp(line, "OUTLINE_SEGMENTED ", 18)) {
			p += 18;
			while (p[0]) {
				auto pold = p;
				std::pair<BRDPoint, BRDPoint> outline_segment;
				double x = READ_DOUBLE();
				outline_segment.first.x  = trunc(x);
				double y = READ_DOUBLE();
				outline_segment.first.y  = trunc(y);
				x = READ_DOUBLE();
				outline_segment.second.x = trunc(x);
				y = READ_DOUBLE();
				outline_segment.second.y = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				outline_segments.push_back(outline_segment);
			}

			if (outline_segments.empty())
				continue;

			// Get first segment and add both points to format
			auto first_outline_segment = outline_segments.front();
			outline_segments.pop_front();
			format.push_back(first_outline_segment.first);
			format.push_back(first_outline_segment.second);

			// Loop through remaining segments picking the best candidate for the next segment
			BRDPoint start_point = first_outline_segment.first;
			BRDPoint end_point = first_outline_segment.second;
			while (start_point != end_point && !outline_segments.empty()) {
				// Loop through segments checking for exact match between points
				auto it = outline_segments.begin();
				bool match_found = false;
				while (it != outline_segments.end()) {
					// If exact match found on either first or second point, add other point to format and remove segment
					if (end_point == it->first) {
						format.push_back(it->second);
						end_point = it->second;
						outline_segments.erase(it);
						match_found = true;
						break;
					} else if (end_point == it->second) {
						format.push_back(it->first);
						end_point = it->first;
						outline_segments.erase(it);
						match_found = true;
						break;
					}
					it++;
				}
				if (match_found)
					continue;

				// Exact match not found, so pick nearest segment instead
				it = std::min_element(
					outline_segments.begin(),
					outline_segments.end(),
					[&end_point](const std::pair<BRDPoint, BRDPoint> &os1, const std::pair<BRDPoint, BRDPoint> &os2) {
						return std::min(manhattan_distance(end_point, os1.first), manhattan_distance(end_point, os1.second))
							< std::min(manhattan_distance(end_point, os2.first), manhattan_distance(end_point, os2.second));
					});

				// Calculate distances for comparison
				auto start_point_distance = manhattan_distance(end_point, start_point);
				auto segment_distance_first = manhattan_distance(end_point, it->first);
				auto segment_distance_second = manhattan_distance(end_point, it->second);

				// If start point is closer than both nearest segment points, format path more likely to be complete
				if (start_point_distance <= segment_distance_first && start_point_distance <= segment_distance_second) {
					format.push_back(start_point);
					end_point = start_point;
					break;
				}

				// Otherwise add points from nearest segment to format with closest point first, then remove segment
				if (segment_distance_first <= segment_distance_second) {
					format.push_back(it->first);
					format.push_back(it->second);
					end_point = it->second;
					outline_segments.erase(it);
				} else {
					format.push_back(it->second);
					format.push_back(it->first);
					end_point = it->first;
					outline_segments.erase(it);
				}
			}
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = num_parts > 0 || num_format > 0;
}